

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O3

int32_t icu_63::hashPartialLocationKey(UHashTok key)

{
  UChar *srcChars;
  int32_t iVar1;
  UnicodeString *pUVar2;
  UnicodeString str;
  UChar local_62;
  UChar *local_60;
  UnicodeString local_50;
  
  UnicodeString::UnicodeString(&local_50,*key.pointer);
  local_62 = L'&';
  pUVar2 = UnicodeString::doAppend(&local_50,&local_62,0,1);
  srcChars = *(UChar **)((long)key.pointer + 8);
  pUVar2 = UnicodeString::doAppend(pUVar2,srcChars,0,-1);
  local_62 = L'#';
  pUVar2 = UnicodeString::doAppend(pUVar2,&local_62,0,1);
  local_62 = L'L';
  if (*(char *)((long)key.pointer + 0x10) == '\0') {
    local_62 = L'S';
  }
  UnicodeString::doAppend(pUVar2,&local_62,0,1);
  local_60 = srcChars;
  iVar1 = UnicodeString::doHashCode(&local_50);
  UnicodeString::~UnicodeString(&local_50);
  return iVar1;
}

Assistant:

static int32_t U_CALLCONV
hashPartialLocationKey(const UHashTok key) {
    // <tzID>&<mzID>#[L|S]
    PartialLocationKey *p = (PartialLocationKey *)key.pointer;
    UnicodeString str(p->tzID);
    str.append((UChar)0x26)
        .append(p->mzID, -1)
        .append((UChar)0x23)
        .append((UChar)(p->isLong ? 0x4C : 0x53));
    return str.hashCode();
}